

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvector-generator.cpp
# Opt level: O0

string * tokens_to_str<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                   (llama_context *ctx,
                   __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> begin,
                   __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end)

{
  bool bVar1;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *in_RSI;
  string *in_RDI;
  string *ret;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffff88
  ;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffff90
  ;
  string *psVar2;
  llama_context *in_stack_ffffffffffffffa8;
  string local_48 [39];
  undefined1 local_21;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *local_20;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_10 [2];
  
  local_21 = 0;
  psVar2 = in_RDI;
  local_20 = in_RSI;
  std::__cxx11::string::string((string *)in_RDI);
  while (bVar1 = __gnu_cxx::operator!=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88), bVar1)
  {
    in_stack_ffffffffffffff90 = local_20;
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
              (local_10);
    common_token_to_piece_abi_cxx11_
              (in_stack_ffffffffffffffa8,(llama_token)((ulong)psVar2 >> 0x20),
               SUB81((ulong)psVar2 >> 0x18,0));
    std::__cxx11::string::operator+=((string *)in_RDI,local_48);
    std::__cxx11::string::~string(local_48);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (local_10);
  }
  return psVar2;
}

Assistant:

static std::string tokens_to_str(llama_context * ctx, Iter begin, Iter end) {
    std::string ret;
    for (; begin != end; ++begin) {
        ret += common_token_to_piece(ctx, *begin);
    }

    return ret;
}